

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O0

uintmax_t __thiscall pstack::Dwarf::Unit::rnglistx(Unit *this,size_t slot)

{
  uintmax_t uVar1;
  bool bVar2;
  unsigned_long end_;
  type_conflict *ptVar3;
  uintmax_t uVar4;
  pair<unsigned_long,_unsigned_long> pVar5;
  uintmax_t local_108;
  type_conflict *dwarflen;
  type_conflict *_;
  unsigned_long local_c8;
  uintmax_t local_c0;
  uintmax_t base;
  undefined1 local_90 [8];
  Attribute attr;
  undefined1 local_50 [24];
  DWARFReader r;
  size_t slot_local;
  Unit *this_local;
  
  r._32_8_ = slot;
  Elf::Section::io((Section *)local_50);
  end_ = std::numeric_limits<unsigned_long>::max();
  DWARFReader::DWARFReader((DWARFReader *)(local_50 + 0x10),(csptr *)local_50,0,end_);
  std::shared_ptr<const_pstack::Reader>::~shared_ptr((shared_ptr<const_pstack::Reader> *)local_50);
  root((DIE *)&base,this);
  DIE::attribute((Attribute *)local_90,(DIE *)&base,DW_AT_rnglists_base,false);
  DIE::~DIE((DIE *)&base);
  bVar2 = DIE::Attribute::valid((Attribute *)local_90);
  if (bVar2) {
    local_108 = DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)local_90);
  }
  else {
    local_108 = 0;
  }
  local_c0 = local_108;
  pVar5 = DWARFReader::getlength((DWARFReader *)(local_50 + 0x10));
  local_c8 = pVar5.second;
  _ = (type_conflict *)pVar5.first;
  std::get<0ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)&_);
  ptVar3 = std::get<1ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)&_);
  DWARFReader::setOffset((DWARFReader *)(local_50 + 0x10),local_c0 + r._32_8_ * *ptVar3);
  uVar1 = local_c0;
  uVar4 = DWARFReader::getuint((DWARFReader *)(local_50 + 0x10),*ptVar3);
  DIE::Attribute::~Attribute((Attribute *)local_90);
  DWARFReader::~DWARFReader((DWARFReader *)(local_50 + 0x10));
  return uVar1 + uVar4;
}

Assistant:

uintmax_t
Unit::rnglistx(size_t slot) {

    DWARFReader r(dwarf->debugRangelists.io(), 0);
    auto attr = root().attribute(DW_AT_rnglists_base);
    auto base = attr.valid() ? uintmax_t(attr) : 0;

    // We need to parse the first part of the header to get the size of the
    // entries in the table.
    auto [ _, dwarflen ] = r.getlength();
    /*
     * We don't need the rest of the fields:
    auto version = r.getuint(2);
    auto address_size = r.getuint(1);
    auto ss_size = r.getuint(1);
    auto offset_entry_count = r.getuint(4);
    */

    // seek to the entry at base + slot ...
    r.setOffset(base + slot * dwarflen);

    // ...then read and add the base.
    return base + r.getuint(dwarflen);
}